

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.hpp
# Opt level: O0

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocation::operator=
          (DescriptorSetAllocation *this,DescriptorSetAllocation *rhs)

{
  DescriptorSetAllocation *rhs_local;
  DescriptorSetAllocation *this_local;
  
  Release(this);
  this->Set = rhs->Set;
  this->CmdQueueMask = rhs->CmdQueueMask;
  this->Pool = rhs->Pool;
  this->DescrSetAllocator = rhs->DescrSetAllocator;
  Reset(rhs);
  return this;
}

Assistant:

DescriptorSetAllocation& operator=(DescriptorSetAllocation&& rhs) noexcept
    {
        Release();

        Set               = rhs.Set;
        CmdQueueMask      = rhs.CmdQueueMask;
        Pool              = rhs.Pool;
        DescrSetAllocator = rhs.DescrSetAllocator;

        rhs.Reset();

        return *this;
    }